

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

void __thiscall
Catch::JsonValueWriter::writeImpl<int,void>(JsonValueWriter *this,int *value,bool quote_value)

{
  StringRef local_38 [2];
  
  std::ostream::operator<<(&this->field_0x18,*value);
  std::__cxx11::stringbuf::str();
  writeImpl(this,local_38[0],quote_value);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void writeImpl( T const& value, bool quote_value ) {
            m_sstream << value;
            writeImpl( m_sstream.str(), quote_value );
        }